

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hh
# Opt level: O2

string * __thiscall
qpdf::util::hex_encode_char_abi_cxx11_(string *__return_storage_ptr__,util *this,char c)

{
  char cVar1;
  char cVar2;
  
  cVar1 = "0123456789abcdef"[((ulong)this & 0xff) >> 4];
  cVar2 = "0123456789abcdef"[(uint)this & 0xf];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '#';
  (__return_storage_ptr__->field_2)._M_local_buf[1] = cVar1;
  (__return_storage_ptr__->field_2)._M_local_buf[2] = cVar2;
  __return_storage_ptr__->_M_string_length = 3;
  (__return_storage_ptr__->field_2)._M_local_buf[3] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string
    hex_encode_char(char c)
    {
        static auto constexpr hexchars = "0123456789abcdef";
        return {'#', hexchars[static_cast<unsigned char>(c) >> 4], hexchars[c & 0x0f]};
    }